

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O2

int run_test_we_get_signal(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  timer_ctx tc;
  signal_ctx sc;
  
  loop = uv_default_loop();
  start_timer(loop,0x11,&tc);
  start_watcher(loop,0x11,&sc,0);
  sc.stop_or_close = STOP;
  iVar1 = uv_run(loop,UV_RUN_DEFAULT);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = (int64_t)tc.ncalls;
    eval_b = 10;
    if (eval_a == 10) {
      eval_a = (int64_t)sc.ncalls;
      eval_b = 10;
      if (eval_a == 10) {
        start_timer(loop,0x11,&tc);
        iVar1 = uv_run(loop,UV_RUN_DEFAULT);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = (int64_t)tc.ncalls;
          eval_b = 10;
          if (eval_a == 10) {
            eval_a = (int64_t)sc.ncalls;
            eval_b = 10;
            if (eval_a == 10) {
              sc.stop_or_close = CLOSE;
              sc.ncalls = 0;
              uv_signal_start(&sc.handle,signal_cb,0x11);
              start_timer(loop,0x11,&tc);
              iVar1 = uv_run(loop,UV_RUN_DEFAULT);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                eval_a = (int64_t)tc.ncalls;
                eval_b = 10;
                if (eval_a == 10) {
                  eval_a = (int64_t)sc.ncalls;
                  eval_b = 10;
                  if (eval_a == 10) {
                    close_loop(loop);
                    eval_a = 0;
                    iVar1 = uv_loop_close(loop);
                    eval_b = (int64_t)iVar1;
                    if (eval_b == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar4 = "uv_loop_close(loop)";
                    pcVar3 = "0";
                    uVar2 = 0xba;
                  }
                  else {
                    pcVar4 = "10";
                    pcVar3 = "sc.ncalls";
                    uVar2 = 0xb8;
                  }
                }
                else {
                  pcVar4 = "10";
                  pcVar3 = "tc.ncalls";
                  uVar2 = 0xb7;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
                uVar2 = 0xb6;
              }
            }
            else {
              pcVar4 = "10";
              pcVar3 = "sc.ncalls";
              uVar2 = 0xaf;
            }
          }
          else {
            pcVar4 = "10";
            pcVar3 = "tc.ncalls";
            uVar2 = 0xae;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
          uVar2 = 0xad;
        }
      }
      else {
        pcVar4 = "10";
        pcVar3 = "sc.ncalls";
        uVar2 = 0xaa;
      }
    }
    else {
      pcVar4 = "10";
      pcVar3 = "tc.ncalls";
      uVar2 = 0xa9;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
    uVar2 = 0xa8;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(we_get_signal) {
  struct signal_ctx sc;
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, &sc, 0);
  sc.stop_or_close = STOP; /* stop, don't close the signal handle */
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc.ncalls, NSIGNALS);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc.ncalls, NSIGNALS);

  sc.ncalls = 0;
  sc.stop_or_close = CLOSE; /* now close it when it's done */
  uv_signal_start(&sc.handle, signal_cb, SIGCHLD);

  start_timer(loop, SIGCHLD, &tc);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc.ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}